

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall QPDFArgParser::handleArgFileArguments(QPDFArgParser *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  reference pvVar4;
  char *__s;
  size_t i;
  long lVar5;
  pointer __n;
  element_type *peVar6;
  allocator<char> local_79;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  shared_ptr<const_char> local_68;
  string local_50;
  
  peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*peVar6->argv,&local_79);
  QUtil::make_shared_cstr((QUtil *)&local_78,&local_50);
  local_68.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_68.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_70._M_pi;
  local_78 = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>::
  emplace_back<std::shared_ptr<char_const>>
            ((vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>> *)
             &peVar6->new_argv,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::__cxx11::string::~string((string *)&local_50);
  lVar5 = 1;
  do {
    peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (peVar6->argc <= lVar5) {
      QUtil::make_shared_array<char_const*>
                ((QUtil *)&local_50,
                 ((long)*(pointer *)
                         ((long)&(peVar6->new_argv).
                                 super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                                 ._M_impl.super__Vector_impl_data + 8) -
                  (long)(peVar6->new_argv).
                        super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) + 1);
      std::__shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      __n = (pointer)0x0;
      while( true ) {
        peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_50._M_dataplus._M_p =
             (pointer)((long)*(pointer *)
                              ((long)&(peVar6->new_argv).
                                      super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) -
                       (long)(peVar6->new_argv).
                             super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4);
        if (local_50._M_dataplus._M_p <= __n) break;
        pvVar4 = std::
                 vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                 ::at(&peVar6->new_argv,(size_type)__n);
        (((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr[(long)__n] =
             (pvVar4->super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        __n = __n + 1;
      }
      iVar2 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                        ((unsigned_long *)&local_50);
      peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar6->argc = iVar2;
      (peVar6->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      [peVar6->argc] = (element_type)0x0;
      peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar6->argv = (peVar6->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
      return;
    }
    __s = peVar6->argv[lVar5];
    sVar3 = strlen(__s);
    if ((sVar3 < 2) || (*__s != '@')) {
LAB_0014f865:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_79);
      QUtil::make_shared_cstr((QUtil *)&local_78,&local_50);
      local_68.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
      local_68.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_70._M_pi;
      local_78 = (element_type *)0x0;
      _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>::
      emplace_back<std::shared_ptr<char_const>>
                ((vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>> *)
                 &peVar6->new_argv,&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_68.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
    }
    else {
      if ((__s[1] != '-') || (__s[2] != '\0')) {
        bVar1 = QUtil::file_can_be_opened(__s + 1);
        peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        __s = peVar6->argv[lVar5];
        if (!bVar1) goto LAB_0014f865;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,__s + 1,(allocator<char> *)&local_68);
      readArgsFromFile(this,&local_50);
    }
    std::__cxx11::string::~string((string *)&local_50);
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void
QPDFArgParser::handleArgFileArguments()
{
    // Support reading arguments from files. Create a new argv. Ensure that argv itself as well as
    // all its contents are automatically deleted by using shared pointers back to the pointers in
    // argv.
    m->new_argv.push_back(QUtil::make_shared_cstr(m->argv[0]));
    for (int i = 1; i < m->argc; ++i) {
        char const* argfile = nullptr;
        if ((strlen(m->argv[i]) > 1) && (m->argv[i][0] == '@')) {
            argfile = 1 + m->argv[i];
            if (strcmp(argfile, "-") != 0) {
                if (!QUtil::file_can_be_opened(argfile)) {
                    // The file's not there; treating as regular option
                    argfile = nullptr;
                }
            }
        }
        if (argfile) {
            readArgsFromFile(1 + m->argv[i]);
        } else {
            m->new_argv.push_back(QUtil::make_shared_cstr(m->argv[i]));
        }
    }
    m->argv_ph = QUtil::make_shared_array<char const*>(1 + m->new_argv.size());
    for (size_t i = 0; i < m->new_argv.size(); ++i) {
        m->argv_ph.get()[i] = m->new_argv.at(i).get();
    }
    m->argc = QIntC::to_int(m->new_argv.size());
    m->argv_ph.get()[m->argc] = nullptr;
    m->argv = m->argv_ph.get();
}